

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

StringPtr __thiscall kj::HttpHeaders::cloneToOwn(HttpHeaders *this,StringPtr str)

{
  size_t in_RCX;
  StringPtr value;
  Array<char> local_80;
  kj *local_58;
  char *pcStack_50;
  undefined1 local_48 [8];
  String copy;
  HttpHeaders *this_local;
  StringPtr str_local;
  StringPtr result;
  
  value.content.ptr = (char *)str.content.size_;
  local_58 = (kj *)str.content.ptr;
  value.content.size_ = in_RCX;
  pcStack_50 = value.content.ptr;
  copy.content.disposer = (ArrayDisposer *)this;
  str_local.content.ptr = value.content.ptr;
  heapString((String *)local_48,local_58,value);
  StringPtr::StringPtr((StringPtr *)&str_local.content.size_,(String *)local_48);
  String::releaseArray(&local_80,(String *)local_48);
  Vector<kj::Array<char>>::add<kj::Array<char>>
            ((Vector<kj::Array<char>> *)&this->ownedStrings,&local_80);
  Array<char>::~Array(&local_80);
  String::~String((String *)local_48);
  return (StringPtr)stack0xffffffffffffffe8;
}

Assistant:

kj::StringPtr HttpHeaders::cloneToOwn(kj::StringPtr str) {
  auto copy = kj::heapString(str);
  kj::StringPtr result = copy;
  ownedStrings.add(copy.releaseArray());
  return result;
}